

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O2

AWeapon * __thiscall FWeaponSlot::PickWeapon(FWeaponSlot *this,player_t *player,bool checkammo)

{
  bool bVar1;
  PClassWeapon *pPVar2;
  AWeapon *pAVar3;
  PClassWeapon *pPVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (player->mo == (APlayerPawn *)0x0) {
    pAVar3 = (AWeapon *)0x0;
  }
  else {
    uVar6 = (ulong)(this->Weapons).Count;
    pAVar3 = player->ReadyWeapon;
    if (uVar6 != 0) {
      if (pAVar3 != (AWeapon *)0x0) {
        for (uVar7 = 0; uVar7 < uVar6; uVar7 = uVar7 + 1) {
          pPVar4 = (this->Weapons).Array[uVar7].Type;
          pPVar2 = (PClassWeapon *)DObject::GetClass((DObject *)player->ReadyWeapon);
          if (pPVar4 == pPVar2) {
LAB_004a2e03:
            uVar6 = uVar7 & 0xffffffff;
            if (uVar7 != 0) goto LAB_004a2e0f;
            do {
              uVar6 = (ulong)(this->Weapons).Count;
LAB_004a2e0f:
              do {
                uVar5 = (int)uVar6 - 1;
                uVar6 = (ulong)uVar5;
                if (uVar7 == uVar6) goto LAB_004a2dfa;
                pAVar3 = (AWeapon *)
                         AActor::FindInventory
                                   (&player->mo->super_AActor,
                                    (PClassActor *)(this->Weapons).Array[(int)uVar5].Type,false);
                if ((pAVar3 != (AWeapon *)0x0) &&
                   (bVar1 = DObject::IsKindOf((DObject *)pAVar3,AWeapon::RegistrationInfo.MyClass),
                   bVar1)) {
                  if (!checkammo) {
                    return pAVar3;
                  }
                  bVar1 = AWeapon::CheckAmmo(pAVar3,2,false,false,-1);
                  if (bVar1) {
                    return pAVar3;
                  }
                }
              } while (uVar5 != 0);
            } while( true );
          }
          if ((((player->ReadyWeapon->super_AStateProvider).super_AInventory.field_0x4fd & 4) != 0)
             && (pAVar3 = GC::ReadBarrier<AWeapon>((AWeapon **)&player->ReadyWeapon->SisterWeapon),
                pAVar3 != (AWeapon *)0x0)) {
            pAVar3 = GC::ReadBarrier<AWeapon>((AWeapon **)&player->ReadyWeapon->SisterWeapon);
            pPVar4 = (PClassWeapon *)DObject::GetClass((DObject *)pAVar3);
            if (pPVar4 == (this->Weapons).Array[uVar7].Type) goto LAB_004a2e03;
          }
LAB_004a2dfa:
          uVar6 = (ulong)(this->Weapons).Count;
        }
      }
      while( true ) {
        uVar6 = uVar6 - 1;
        if ((int)(uint)uVar6 < 0) break;
        pAVar3 = (AWeapon *)
                 AActor::FindInventory
                           (&player->mo->super_AActor,
                            (PClassActor *)(this->Weapons).Array[(uint)uVar6 & 0x7fffffff].Type,
                            false);
        if ((pAVar3 != (AWeapon *)0x0) &&
           (bVar1 = DObject::IsKindOf((DObject *)pAVar3,AWeapon::RegistrationInfo.MyClass), bVar1))
        {
          if (!checkammo) {
            return pAVar3;
          }
          bVar1 = AWeapon::CheckAmmo(pAVar3,2,false,false,-1);
          if (bVar1) {
            return pAVar3;
          }
        }
      }
      pAVar3 = player->ReadyWeapon;
    }
  }
  return pAVar3;
}

Assistant:

AWeapon *FWeaponSlot::PickWeapon(player_t *player, bool checkammo)
{
	int i, j;

	if (player->mo == NULL)
	{
		return NULL;
	}
	// Does this slot even have any weapons?
	if (Weapons.Size() == 0)
	{
		return player->ReadyWeapon;
	}
	if (player->ReadyWeapon != NULL)
	{
		for (i = 0; (unsigned)i < Weapons.Size(); i++)
		{
			if (Weapons[i].Type == player->ReadyWeapon->GetClass() ||
				(player->ReadyWeapon->WeaponFlags & WIF_POWERED_UP &&
				 player->ReadyWeapon->SisterWeapon != NULL &&
				 player->ReadyWeapon->SisterWeapon->GetClass() == Weapons[i].Type))
			{
				for (j = (i == 0 ? Weapons.Size() - 1 : i - 1);
					j != i;
					j = (j == 0 ? Weapons.Size() - 1 : j - 1))
				{
					AWeapon *weap = static_cast<AWeapon *> (player->mo->FindInventory(Weapons[j].Type));

					if (weap != NULL && weap->IsKindOf(RUNTIME_CLASS(AWeapon)))
					{
						if (!checkammo || weap->CheckAmmo(AWeapon::EitherFire, false))
						{
							return weap;
						}
					}
				}
			}
		}
	}
	for (i = Weapons.Size() - 1; i >= 0; i--)
	{
		AWeapon *weap = static_cast<AWeapon *> (player->mo->FindInventory(Weapons[i].Type));

		if (weap != NULL && weap->IsKindOf(RUNTIME_CLASS(AWeapon)))
		{
			if (!checkammo || weap->CheckAmmo(AWeapon::EitherFire, false))
			{
				return weap;
			}
		}
	}
	return player->ReadyWeapon;
}